

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void SimpleLogger::setCrashDumpPath(string *path,bool origin_only)

{
  bool origin_only_00;
  SimpleLoggerMgr *pSVar1;
  byte in_SIL;
  string *in_RDI;
  SimpleLoggerMgr *mgr;
  
  origin_only_00 = (bool)(in_SIL & 1);
  pSVar1 = SimpleLoggerMgr::get();
  if (pSVar1 != (SimpleLoggerMgr *)0x0) {
    SimpleLoggerMgr::setCrashDumpPath(mgr,in_RDI,origin_only_00);
  }
  return;
}

Assistant:

void SimpleLogger::setCrashDumpPath(const std::string& path,
                                    bool origin_only)
{
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    if (mgr) {
        mgr->setCrashDumpPath(path, origin_only);
    }
}